

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::StartGroup(JunitReporter *this,string *groupName)

{
  pointer pcVar1;
  undefined1 local_88 [40];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  local_40;
  
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._32_8_ = 0.0;
  pcVar1 = (groupName->_M_dataplus)._M_p;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + groupName->_M_string_length);
  local_40.
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
  emplace_back<Catch::JunitReporter::Stats>(&this->m_statsForSuites,(Stats *)local_88);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::~vector(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  this->m_currentStats =
       (this->m_statsForSuites).
       super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_statsForSuites.push_back( Stats( groupName ) );
            m_currentStats = &m_statsForSuites.back();
        }